

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O0

int target_get_dynamic_node_properties
              (TARGET_HANDLE target,node_properties *dynamic_node_properties_value)

{
  int iVar1;
  AMQP_TYPE AVar2;
  AMQP_VALUE value;
  int get_single_value_result;
  AMQP_VALUE item_value;
  TARGET_INSTANCE *target_instance;
  uint32_t item_count;
  int result;
  node_properties *dynamic_node_properties_value_local;
  TARGET_HANDLE target_local;
  
  if (target == (TARGET_HANDLE)0x0) {
    target_instance._4_4_ = 0x379c;
  }
  else {
    _item_count = dynamic_node_properties_value;
    dynamic_node_properties_value_local = &target->composite_value;
    iVar1 = amqpvalue_get_composite_item_count(target->composite_value,(uint32_t *)&target_instance)
    ;
    if (iVar1 == 0) {
      if ((uint)target_instance < 6) {
        target_instance._4_4_ = 0x37aa;
      }
      else {
        value = amqpvalue_get_composite_item_in_place(target->composite_value,5);
        if ((value == (AMQP_VALUE)0x0) ||
           (AVar2 = amqpvalue_get_type(value), AVar2 == AMQP_TYPE_NULL)) {
          target_instance._4_4_ = 0x37b2;
        }
        else {
          iVar1 = amqpvalue_get_map(value,_item_count);
          if (iVar1 == 0) {
            target_instance._4_4_ = 0;
          }
          else {
            target_instance._4_4_ = 0x37b9;
          }
        }
      }
    }
    else {
      target_instance._4_4_ = 0x37a4;
    }
  }
  return target_instance._4_4_;
}

Assistant:

int target_get_dynamic_node_properties(TARGET_HANDLE target, node_properties* dynamic_node_properties_value)
{
    int result;

    if (target == NULL)
    {
        result = MU_FAILURE;
    }
    else
    {
        uint32_t item_count;
        TARGET_INSTANCE* target_instance = (TARGET_INSTANCE*)target;
        if (amqpvalue_get_composite_item_count(target_instance->composite_value, &item_count) != 0)
        {
            result = MU_FAILURE;
        }
        else
        {
            if (item_count <= 5)
            {
                result = MU_FAILURE;
            }
            else
            {
                AMQP_VALUE item_value = amqpvalue_get_composite_item_in_place(target_instance->composite_value, 5);
                if ((item_value == NULL) ||
                    (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL))
                {
                    result = MU_FAILURE;
                }
                else
                {
                    int get_single_value_result = amqpvalue_get_node_properties(item_value, dynamic_node_properties_value);
                    if (get_single_value_result != 0)
                    {
                        result = MU_FAILURE;
                    }
                    else
                    {
                        result = 0;
                    }
                }
            }
        }
    }

    return result;
}